

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRImageFromFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  int iVar1;
  FILE *__stream;
  ulong __n;
  size_t sVar2;
  reference memory;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  if (exr_image == (EXRImage *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"Invalid argument for LoadEXRImageFromFile",
               (allocator<char> *)&local_70);
    tinyexr::SetErrorMessage((string *)&buf,err);
    std::__cxx11::string::~string((string *)&buf);
    iVar1 = -3;
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,filename,&local_71);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                     "Cannot read file ",&local_70);
      tinyexr::SetErrorMessage((string *)&buf,err);
      std::__cxx11::string::~string((string *)&buf);
      std::__cxx11::string::~string((string *)&local_70);
      iVar1 = -7;
    }
    else {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      if (__n < 0x10) {
        fclose(__stream);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,filename,&local_71);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                       "File size too short ",&local_70);
        tinyexr::SetErrorMessage((string *)&buf,err);
        std::__cxx11::string::~string((string *)&buf);
        std::__cxx11::string::~string((string *)&local_70);
        iVar1 = -5;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&buf,__n,(allocator_type *)&local_70);
        sVar2 = fread(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,1,__n,__stream);
        if (sVar2 != __n) {
          __assert_fail("ret == filesize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                        ,0x2ec6,
                        "int LoadEXRImageFromFile(EXRImage *, const EXRHeader *, const char *, const char **)"
                       );
        }
        fclose(__stream);
        memory = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        iVar1 = LoadEXRImageFromMemory(exr_image,exr_header,memory,__n,err);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
    }
  }
  return iVar1;
}

Assistant:

int LoadEXRImageFromFile(EXRImage *exr_image, const EXRHeader *exr_header,
                         const char *filename, const char **err) {
  if (exr_image == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRImageFromFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  if (filesize < 16) {
    fclose(fp);
    tinyexr::SetErrorMessage("File size too short " + std::string(filename),
                             err);
    return TINYEXR_ERROR_INVALID_FILE;
  }

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    TEXR_ASSERT(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadEXRImageFromMemory(exr_image, exr_header, &buf.at(0), filesize,
                                err);
}